

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O2

void __thiscall
chrono::utils::Generator::CreateObjectsBox
          (Generator *this,Sampler<double> *sampler,ChVector<double> *pos,ChVector<double> *hdims,
          ChVector<double> *vel)

{
  int iVar1;
  double in_XMM0_Qa;
  PointVector points;
  _Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> local_48;
  
  normalizeMixture(this);
  (*sampler->_vptr_Sampler[2])(sampler);
  iVar1 = (*(this->m_system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                    ();
  if (iVar1 == 1) {
    in_XMM0_Qa = calcMinSeparation(this,in_XMM0_Qa);
  }
  (*sampler->_vptr_Sampler[3])(in_XMM0_Qa,sampler);
  Sampler<double>::SampleBox((PointVector *)&local_48,sampler,pos,hdims);
  createObjects(this,(PointVector *)&local_48,vel);
  std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
  ~_Vector_base(&local_48);
  return;
}

Assistant:

void Generator::CreateObjectsBox(Sampler<double>& sampler,
                                 const ChVector<>& pos,
                                 const ChVector<>& hdims,
                                 const ChVector<>& vel) {
    // Normalize the mixture ratios
    normalizeMixture();

    // Generate the object locations
    double sep = sampler.GetSeparation();
    if (m_system->GetContactMethod() == ChContactMethod::SMC)
        sep = calcMinSeparation(sep);
    sampler.SetSeparation(sep);

    PointVector points = sampler.SampleBox(pos, hdims);
    createObjects(points, vel);
}